

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> * __thiscall
capnp::RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::operator=
          (RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *this,
          RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *other)

{
  PromiseArenaMember *node;
  Disposer *pDVar1;
  PipelineHook *pPVar2;
  PipelineOp *pPVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  node = &((this->
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
           ).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  (this->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>).
  super_PromiseBase.node.ptr =
       (other->
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
       ).super_PromiseBase.node.ptr;
  (other->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>).
  super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  pDVar1 = (this->super_Pipeline)._typeless.hook.disposer;
  pPVar2 = (this->super_Pipeline)._typeless.hook.ptr;
  uVar6 = *(undefined4 *)((long)&(other->super_Pipeline)._typeless.hook.disposer + 4);
  uVar7 = *(undefined4 *)&(other->super_Pipeline)._typeless.hook.ptr;
  uVar8 = *(undefined4 *)((long)&(other->super_Pipeline)._typeless.hook.ptr + 4);
  *(undefined4 *)&(this->super_Pipeline)._typeless.hook.disposer =
       *(undefined4 *)&(other->super_Pipeline)._typeless.hook.disposer;
  *(undefined4 *)((long)&(this->super_Pipeline)._typeless.hook.disposer + 4) = uVar6;
  *(undefined4 *)&(this->super_Pipeline)._typeless.hook.ptr = uVar7;
  *(undefined4 *)((long)&(this->super_Pipeline)._typeless.hook.ptr + 4) = uVar8;
  (other->super_Pipeline)._typeless.hook.ptr = (PipelineHook *)0x0;
  if (pPVar2 != (PipelineHook *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pPVar2->_vptr_PipelineHook[-2] + (long)&pPVar2->_vptr_PipelineHook);
  }
  pPVar3 = (this->super_Pipeline)._typeless.ops.ptr;
  if (pPVar3 != (PipelineOp *)0x0) {
    sVar4 = (this->super_Pipeline)._typeless.ops.size_;
    (this->super_Pipeline)._typeless.ops.ptr = (PipelineOp *)0x0;
    (this->super_Pipeline)._typeless.ops.size_ = 0;
    pAVar5 = (this->super_Pipeline)._typeless.ops.disposer;
    (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pPVar3,8,sVar4,sVar4,0);
  }
  (this->super_Pipeline)._typeless.ops.ptr = (other->super_Pipeline)._typeless.ops.ptr;
  (this->super_Pipeline)._typeless.ops.size_ = (other->super_Pipeline)._typeless.ops.size_;
  (this->super_Pipeline)._typeless.ops.disposer = (other->super_Pipeline)._typeless.ops.disposer;
  (other->super_Pipeline)._typeless.ops.ptr = (PipelineOp *)0x0;
  (other->super_Pipeline)._typeless.ops.size_ = 0;
  return this;
}

Assistant:

RemotePromise& operator=(RemotePromise&& other) = default;